

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>,_true> __thiscall
duckdb::LikeMatcher::CreateLikeMatcher(LikeMatcher *this,string *like_pattern,char escape)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  _func_int *p_Var3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pLVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined1 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined1 uVar13;
  ulong uVar14;
  vector<duckdb::LikeSegment,_true> segments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_> local_68;
  vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_> local_48;
  
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = like_pattern->_M_string_length;
  if (uVar8 == 0) {
    uVar13 = 0;
    uVar11 = 0;
  }
  else {
    uVar9 = 0;
    uVar14 = 0;
    uVar13 = 0;
    uVar11 = 0;
    do {
      cVar2 = (like_pattern->_M_dataplus)._M_p[uVar14];
      if (((cVar2 == escape) || (cVar2 == '%')) || (cVar2 == '_')) {
        if (uVar9 < uVar14) {
          ::std::__cxx11::string::substr((ulong)&local_88,(ulong)like_pattern);
          ::std::vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>>::
          emplace_back<std::__cxx11::string>
                    ((vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>> *)&local_68,
                     &local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        if ((cVar2 == escape) || (cVar2 == '_')) goto LAB_014d0d4f;
        uVar9 = uVar14 + 1;
        if (uVar14 == 0) {
          uVar11 = 1;
        }
        uVar8 = like_pattern->_M_string_length;
        if (uVar9 == uVar8) {
          uVar13 = 1;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar8);
    if (uVar9 < uVar8) {
      ::std::__cxx11::string::substr((ulong)&local_88,(ulong)like_pattern);
      ::std::vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>>::
      emplace_back<std::__cxx11::string>
                ((vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>> *)&local_68,
                 &local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
  }
  pLVar5 = local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar4 = local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_finish) {
LAB_014d0d4f:
    (this->super_FunctionData)._vptr_FunctionData = (_func_int **)0x0;
  }
  else {
    pp_Var7 = (_func_int **)operator_new(0x48);
    pLVar6 = local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    paVar1 = &local_88.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(like_pattern->_M_dataplus)._M_p;
    paVar12 = &like_pattern->field_2;
    if (paVar10 == paVar12) {
      local_88.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_88.field_2._8_8_ = *(undefined8 *)((long)&like_pattern->field_2 + 8);
      paVar10 = paVar1;
    }
    else {
      local_88.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    p_Var3 = (_func_int *)like_pattern->_M_string_length;
    (like_pattern->_M_dataplus)._M_p = (pointer)paVar12;
    like_pattern->_M_string_length = 0;
    (like_pattern->field_2)._M_local_buf[0] = '\0';
    local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *pp_Var7 = (_func_int *)&PTR__LikeMatcher_02452250;
    pp_Var7[1] = (_func_int *)(pp_Var7 + 3);
    if (paVar10 == paVar1) {
      pp_Var7[3] = (_func_int *)local_88.field_2._M_allocated_capacity;
      pp_Var7[4] = (_func_int *)local_88.field_2._8_8_;
    }
    else {
      pp_Var7[1] = (_func_int *)paVar10;
      pp_Var7[3] = (_func_int *)local_88.field_2._M_allocated_capacity;
    }
    pp_Var7[2] = p_Var3;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity =
         local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pp_Var7[5] = (_func_int *)pLVar4;
    pp_Var7[6] = (_func_int *)pLVar5;
    pp_Var7[7] = (_func_int *)pLVar6;
    local_48.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)(pp_Var7 + 8) = uVar11;
    *(undefined1 *)((long)pp_Var7 + 0x41) = uVar13;
    (this->super_FunctionData)._vptr_FunctionData = pp_Var7;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    ::std::vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  ::std::vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>::~vector(&local_68);
  return (unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>_>)
         (unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>_>)this;
}

Assistant:

static unique_ptr<LikeMatcher> CreateLikeMatcher(string like_pattern, char escape = '\0') {
		vector<LikeSegment> segments;
		idx_t last_non_pattern = 0;
		bool has_start_percentage = false;
		bool has_end_percentage = false;
		for (idx_t i = 0; i < like_pattern.size(); i++) {
			auto ch = like_pattern[i];
			if (ch == escape || ch == '%' || ch == '_') {
				// special character, push a constant pattern
				if (i > last_non_pattern) {
					segments.emplace_back(like_pattern.substr(last_non_pattern, i - last_non_pattern));
				}
				last_non_pattern = i + 1;
				if (ch == escape || ch == '_') {
					// escape or underscore: could not create efficient like matcher
					// FIXME: we could handle escaped percentages here
					return nullptr;
				} else {
					// sample_size
					if (i == 0) {
						has_start_percentage = true;
					}
					if (i + 1 == like_pattern.size()) {
						has_end_percentage = true;
					}
				}
			}
		}
		if (last_non_pattern < like_pattern.size()) {
			segments.emplace_back(like_pattern.substr(last_non_pattern, like_pattern.size() - last_non_pattern));
		}
		if (segments.empty()) {
			return nullptr;
		}
		return make_uniq<LikeMatcher>(std::move(like_pattern), std::move(segments), has_start_percentage,
		                              has_end_percentage);
	}